

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_scan.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_rowcol_scan
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int *piVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  parasail_result_t *ppVar7;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  int *ptr_02;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  size_t size;
  long lVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  int *__s;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  long lVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  ulong local_70;
  int *local_50;
  
  if (_s2 == (char *)0x0) {
    parasail_sg_flags_rowcol_scan_cold_7();
    return (parasail_result_t *)0x0;
  }
  local_70 = (ulong)(uint)s2Len;
  if (s2Len < 1) {
    parasail_sg_flags_rowcol_scan_cold_6();
    return (parasail_result_t *)0x0;
  }
  if (open < 0) {
    parasail_sg_flags_rowcol_scan_cold_5();
    return (parasail_result_t *)0x0;
  }
  if (gap < 0) {
    parasail_sg_flags_rowcol_scan_cold_4();
    return (parasail_result_t *)0x0;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sg_flags_rowcol_scan_cold_3();
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 0) {
    if (_s1 == (char *)0x0) {
      parasail_sg_flags_rowcol_scan_cold_2();
      return (parasail_result_t *)0x0;
    }
    uVar12 = (ulong)(uint)_s1Len;
    if (_s1Len < 1) {
      parasail_sg_flags_rowcol_scan_cold_1();
      return (parasail_result_t *)0x0;
    }
  }
  else {
    uVar12 = (ulong)(uint)matrix->length;
  }
  iVar11 = (int)uVar12;
  ppVar7 = parasail_result_new_rowcol1(iVar11,s2Len);
  if (ppVar7 == (parasail_result_t *)0x0) {
    return (parasail_result_t *)0x0;
  }
  ppVar7->flag = (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar7->flag | 0x1440202;
  ptr = parasail_memalign_int(0x10,(ulong)(uint)s2Len);
  uVar5 = iVar11 + 1;
  ptr_00 = parasail_memalign_int(0x10,(long)(int)uVar5);
  size = (size_t)iVar11;
  ptr_01 = parasail_memalign_int(0x10,size);
  ptr_02 = parasail_memalign_int(0x10,(long)(int)uVar5);
  auVar19._0_4_ = -(uint)((int)((ulong)ptr >> 0x20) == 0 && (int)ptr == 0);
  auVar19._4_4_ = -(uint)((int)ptr_00 == 0 && (int)((ulong)ptr_00 >> 0x20) == 0);
  auVar19._8_4_ = -(uint)((int)((ulong)ptr_01 >> 0x20) == 0 && (int)ptr_01 == 0);
  auVar19._12_4_ = -(uint)((int)ptr_02 == 0 && (int)((ulong)ptr_02 >> 0x20) == 0);
  iVar6 = movmskps((int)ptr_02,auVar19);
  if (iVar6 != 0) {
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 0) {
    local_50 = parasail_memalign_int(0x10,size);
    if (local_50 == (int *)0x0) {
      return (parasail_result_t *)0x0;
    }
    if (0 < iVar11) {
      piVar1 = matrix->mapper;
      uVar10 = 0;
      do {
        local_50[uVar10] = piVar1[(byte)_s1[uVar10]];
        uVar10 = uVar10 + 1;
      } while (uVar12 != uVar10);
    }
  }
  else {
    local_50 = (int *)0x0;
  }
  __s = ptr_00 + 1;
  piVar1 = matrix->mapper;
  uVar10 = 0;
  do {
    ptr[uVar10] = piVar1[(byte)_s2[uVar10]];
    uVar10 = uVar10 + 1;
  } while ((uint)s2Len != uVar10);
  *ptr_00 = 0;
  *ptr_02 = 0;
  auVar19 = _DAT_00903aa0;
  if (s1_beg == 0) {
    if (0 < iVar11) {
      lVar14 = uVar12 - 1;
      auVar20._8_4_ = (int)lVar14;
      auVar20._0_8_ = lVar14;
      auVar20._12_4_ = (int)((ulong)lVar14 >> 0x20);
      iVar6 = -open;
      lVar14 = 0;
      auVar20 = auVar20 ^ _DAT_00903aa0;
      auVar25 = _DAT_00903a90;
      do {
        auVar24 = auVar25 ^ auVar19;
        if ((bool)(~(auVar24._4_4_ == auVar20._4_4_ && auVar20._0_4_ < auVar24._0_4_ ||
                    auVar20._4_4_ < auVar24._4_4_) & 1)) {
          *(int *)((long)ptr_00 + lVar14 + 4) = iVar6;
        }
        if ((auVar24._12_4_ != auVar20._12_4_ || auVar24._8_4_ <= auVar20._8_4_) &&
            auVar24._12_4_ <= auVar20._12_4_) {
          *(int *)((long)ptr_00 + lVar14 + 8) = iVar6 - gap;
        }
        lVar22 = auVar25._8_8_;
        auVar25._0_8_ = auVar25._0_8_ + 2;
        auVar25._8_8_ = lVar22 + 2;
        lVar14 = lVar14 + 8;
        iVar6 = iVar6 + gap * -2;
      } while ((ulong)(uVar5 >> 1) << 3 != lVar14);
      goto LAB_0055b396;
    }
LAB_0055b497:
    bVar2 = false;
  }
  else {
    if (iVar11 < 1) goto LAB_0055b497;
    memset(__s,0,uVar12 * 4);
LAB_0055b396:
    auVar19 = _DAT_00903aa0;
    lVar14 = uVar12 - 1;
    auVar21._8_4_ = (int)lVar14;
    auVar21._0_8_ = lVar14;
    auVar21._12_4_ = (int)((ulong)lVar14 >> 0x20);
    uVar10 = 0;
    auVar21 = auVar21 ^ _DAT_00903aa0;
    auVar24 = _DAT_00903a80;
    auVar23 = _DAT_00903a90;
    do {
      auVar25 = auVar23 ^ auVar19;
      iVar6 = auVar21._4_4_;
      if ((bool)(~(auVar25._4_4_ == iVar6 && auVar21._0_4_ < auVar25._0_4_ || iVar6 < auVar25._4_4_)
                & 1)) {
        ptr_01[uVar10] = -0x40000000;
      }
      if ((auVar25._12_4_ != auVar21._12_4_ || auVar25._8_4_ <= auVar21._8_4_) &&
          auVar25._12_4_ <= auVar21._12_4_) {
        ptr_01[uVar10 + 1] = -0x40000000;
      }
      auVar25 = auVar24 ^ auVar19;
      iVar15 = auVar25._4_4_;
      if (iVar15 <= iVar6 && (iVar15 != iVar6 || auVar25._0_4_ <= auVar21._0_4_)) {
        ptr_01[uVar10 + 2] = -0x40000000;
        ptr_01[uVar10 + 3] = -0x40000000;
      }
      uVar10 = uVar10 + 4;
      lVar14 = auVar23._8_8_;
      auVar23._0_8_ = auVar23._0_8_ + 4;
      auVar23._8_8_ = lVar14 + 4;
      lVar14 = auVar24._8_8_;
      auVar24._0_8_ = auVar24._0_8_ + 4;
      auVar24._8_8_ = lVar14 + 4;
    } while ((iVar11 + 3U & 0xfffffffc) != uVar10);
    bVar2 = true;
  }
  uVar5 = s2Len - 1;
  uVar10 = uVar12;
  if (s2Len == 1) {
    local_70 = 1;
    iVar6 = -0x40000000;
  }
  else {
    uVar9 = 1;
    if (1 < (int)uVar5) {
      uVar9 = (ulong)uVar5;
    }
    iVar6 = -0x40000000;
    uVar17 = 0;
    do {
      if (bVar2) {
        uVar8 = 0;
        do {
          iVar15 = __s[uVar8] - open;
          if (__s[uVar8] - open < ptr_01[uVar8] - gap) {
            iVar15 = ptr_01[uVar8] - gap;
          }
          ptr_01[uVar8] = iVar15;
          uVar8 = uVar8 + 1;
        } while (uVar12 != uVar8);
        if (!bVar2) goto LAB_0055b5ed;
        piVar1 = matrix->matrix;
        uVar8 = 0;
        do {
          if (matrix->type == 0) {
            iVar15 = local_50[uVar8];
          }
          else {
            iVar15 = (int)uVar8;
          }
          iVar15 = ptr_00[uVar8] + piVar1[(long)(matrix->size * iVar15) + (long)ptr[uVar17]];
          if (iVar15 <= ptr_01[uVar8]) {
            iVar15 = ptr_01[uVar8];
          }
          ptr_02[uVar8 + 1] = iVar15;
          uVar8 = uVar8 + 1;
        } while (uVar12 != uVar8);
        iVar15 = -((int)uVar17 * gap + open);
        if (s2_beg != 0) {
          iVar15 = 0;
        }
        *ptr_02 = iVar15;
        if (bVar2) {
          iVar13 = -0x40000000;
          uVar8 = 0;
          do {
            iVar13 = iVar13 - gap;
            if (iVar13 < ptr_02[uVar8]) {
              iVar13 = ptr_02[uVar8];
            }
            iVar16 = iVar13 - open;
            if (iVar13 - open < ptr_02[uVar8 + 1]) {
              iVar16 = ptr_02[uVar8 + 1];
            }
            __s[uVar8] = iVar16;
            uVar8 = uVar8 + 1;
          } while (uVar12 != uVar8);
        }
      }
      else {
LAB_0055b5ed:
        iVar15 = -((int)uVar17 * gap + open);
        if (s2_beg != 0) {
          iVar15 = 0;
        }
        *ptr_02 = iVar15;
      }
      *ptr_00 = iVar15;
      iVar15 = ptr_00[(long)(int)(iVar11 - 1U) + 1];
      ((ppVar7->field_4).rowcols)->score_row[uVar17] = iVar15;
      if (s2_end != 0 && iVar6 < iVar15) {
        uVar10 = (ulong)(iVar11 - 1U);
        local_70 = uVar17;
        iVar6 = iVar15;
      }
      local_70 = local_70 & 0xffffffff;
      uVar17 = uVar17 + 1;
    } while (uVar17 != uVar9);
  }
  iVar15 = (int)uVar10;
  if (bVar2) {
    uVar9 = 0;
    do {
      iVar13 = __s[uVar9] - open;
      if (__s[uVar9] - open < ptr_01[uVar9] - gap) {
        iVar13 = ptr_01[uVar9] - gap;
      }
      ptr_01[uVar9] = iVar13;
      uVar9 = uVar9 + 1;
    } while (uVar12 != uVar9);
    if (bVar2) {
      piVar1 = matrix->matrix;
      uVar9 = 0;
      do {
        if (matrix->type == 0) {
          iVar13 = local_50[uVar9];
        }
        else {
          iVar13 = (int)uVar9;
        }
        iVar13 = ptr_00[uVar9] + piVar1[(long)(matrix->size * iVar13) + (long)ptr[uVar5]];
        if (iVar13 <= ptr_01[uVar9]) {
          iVar13 = ptr_01[uVar9];
        }
        ptr_02[uVar9 + 1] = iVar13;
        uVar9 = uVar9 + 1;
      } while (uVar12 != uVar9);
      iVar13 = 0;
      if (s2_beg == 0) {
        iVar13 = -(uVar5 * gap + open);
      }
      *ptr_02 = iVar13;
      if (bVar2) {
        iVar13 = -0x40000000;
        uVar9 = 0;
        do {
          iVar13 = iVar13 - gap;
          if (iVar13 < ptr_02[uVar9]) {
            iVar13 = ptr_02[uVar9];
          }
          iVar15 = iVar13 - open;
          if (iVar13 - open < ptr_02[uVar9 + 1]) {
            iVar15 = ptr_02[uVar9 + 1];
          }
          __s[uVar9] = iVar15;
          ((ppVar7->field_4).rowcols)->score_col[uVar9] = iVar15;
          if ((s1_end != 0) && (iVar6 < __s[uVar9])) {
            uVar10 = uVar9 & 0xffffffff;
            local_70 = (ulong)uVar5;
            iVar6 = __s[uVar9];
          }
          iVar15 = (int)uVar10;
          uVar9 = uVar9 + 1;
        } while (uVar12 != uVar9);
      }
      goto LAB_0055b79e;
    }
  }
  iVar13 = 0;
  if (s2_beg == 0) {
    iVar13 = -(gap * uVar5 + open);
  }
  *ptr_02 = iVar13;
LAB_0055b79e:
  bVar18 = s2_end != 0;
  iVar13 = ptr_00[size];
  bVar2 = iVar6 < iVar13;
  bVar3 = s1_end == 0;
  bVar4 = s2_end == 0;
  if (bVar3 && bVar4 || bVar2 && bVar18) {
    iVar6 = iVar13;
  }
  iVar11 = iVar11 + -1;
  if ((!bVar3 || !bVar4) && (!bVar2 || !bVar18)) {
    iVar11 = iVar15;
  }
  if (bVar3 && bVar4 || bVar2 && bVar18) {
    local_70._0_4_ = uVar5;
  }
  ((ppVar7->field_4).rowcols)->score_row[uVar5] = iVar13;
  ppVar7->score = iVar6;
  ppVar7->end_query = iVar11;
  ppVar7->end_ref = (uint)local_70;
  parasail_free(ptr_02);
  parasail_free(ptr_01);
  parasail_free(ptr_00);
  parasail_free(ptr);
  if (matrix->type == 0) {
    parasail_free(local_50);
    return ppVar7;
  }
  return ppVar7;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict HB = NULL;
    int * restrict H = NULL;
    int * restrict E = NULL;
    int * restrict HtB = NULL;
    int * restrict Ht = NULL;
    int s1Len = 0;
    int i = 0;
    int j = 0;
    int score = 0;
    int end_query = 0;
    int end_ref = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    i = 0;
    j = 0;
    score = NEG_INF_32;
    end_query = s1Len;
    end_ref = s2Len;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_NOVEC_SCAN
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2 = parasail_memalign_int(16, s2Len);
    HB = parasail_memalign_int(16, s1Len+1);
    H  = HB+1;
    E  = parasail_memalign_int(16, s1Len);
    HtB= parasail_memalign_int(16, s1Len+1);
    Ht = HtB+1;

    /* validate heap variables */
    if (!s2) return NULL;
    if (!HB) return NULL;
    if (!E) return NULL;
    if (!HtB) return NULL;

    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int(16, s1Len);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
    }

    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* initialize H */
    H[-1] = 0;
    Ht[-1] = 0;
    if (s1_beg) {
        for (i=0; i<s1Len; ++i) {
            H[i] = 0;
        }
    }
    else {
        for (i=0; i<s1Len; ++i) {
            H[i] = -open -i*gap;
        }
    }

    /* initialize E */
    for (i=0; i<s1Len; ++i) {
        E[i] = NEG_INF_32;
    }

    /* iterate over database */
    for (j=0; j<s2Len-1; ++j) {
        int Ft = NEG_INF_32;
        /* calculate E */
        for (i=0; i<s1Len; ++i) {
            E[i] = MAX(E[i]-gap, H[i]-open);
        }
        /* calculate Ht */
        for (i=0; i<s1Len; ++i) {
            int matval = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
                         matrix->matrix[matrix->size*s1[i]+s2[j]] :
                         matrix->matrix[matrix->size*i+s2[j]];
            Ht[i] = MAX(H[i-1]+matval, E[i]);
        }
        Ht[-1] = s2_beg ? 0 : (-open -j*gap);
        /* calculate H */
        for (i=0; i<s1Len; ++i) {
            int Ft_opn;
            int Ht_pre = Ht[i-1];
            int Ft_ext = Ft-gap;
            if (Ht_pre >= Ft_ext) {
                Ft = Ht_pre;
            }
            else {
                Ft = Ft_ext;
            }
            Ft_opn = Ft-open;
            H[i] = MAX(Ht[i], Ft_opn);
#ifdef PARASAIL_TABLE
            result->tables->score_table[i*s2Len + j] = H[i];
#endif
        }
        H[-1] = s2_beg ? 0 : (-open - j*gap);
#ifdef PARASAIL_ROWCOL
        result->rowcols->score_row[j] = H[s1Len-1];
#endif
        if (s2_end && H[s1Len-1] > score) {
            score = H[s1Len-1];
            end_query = s1Len-1;
            end_ref = j;
        }
    }
    j = s2Len - 1;
    {
        int Ft = NEG_INF_32;
        /* calculate E */
        for (i=0; i<s1Len; ++i) {
            E[i] = MAX(E[i]-gap, H[i]-open);
        }
        /* calculate Ht */
        for (i=0; i<s1Len; ++i) {
            int matval = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
                         matrix->matrix[matrix->size*s1[i]+s2[j]] :
                         matrix->matrix[matrix->size*i+s2[j]];
            Ht[i] = MAX(H[i-1]+matval, E[i]);
        }
        Ht[-1] = s2_beg ? 0 : (-open -j*gap);
        /* calculate H */
        for (i=0; i<s1Len; ++i) {
            int Ft_opn;
            int Ht_pre = Ht[i-1];
            int Ft_ext = Ft-gap;
            if (Ht_pre >= Ft_ext) {
                Ft = Ht_pre;
            }
            else {
                Ft = Ft_ext;
            }
            Ft_opn = Ft-open;
            H[i] = MAX(Ht[i], Ft_opn);
#ifdef PARASAIL_TABLE
            result->tables->score_table[i*s2Len + j] = H[i];
#endif
#ifdef PARASAIL_ROWCOL
            result->rowcols->score_col[i] = H[i];
#endif
            if (s1_end && H[i] > score) {
                score = H[i];
                end_query = i;
                end_ref = j;
            }
        }
#ifdef PARASAIL_ROWCOL
        result->rowcols->score_row[j] = H[s1Len-1];
#endif
    }
    if (s2_end && H[s1Len-1] > score) {
        score = H[s1Len-1];
        end_query = s1Len-1;
        end_ref = s2Len-1;
    }
    if (!s1_end && !s2_end) {
        score = H[s1Len-1];
        end_query = s1Len-1;
        end_ref = s2Len-1;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(HtB);
    parasail_free(E);
    parasail_free(HB);
    parasail_free(s2);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}